

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O0

void __thiscall cmParseCoberturaCoverage::XMLParser::~XMLParser(XMLParser *this)

{
  XMLParser *this_local;
  
  ~XMLParser(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

XMLParser(cmCTest* ctest, cmCTestCoverageHandlerContainer& cont)
    : FilePaths{ cont.SourceDir, cont.BinaryDir }
    , CTest(ctest)
    , Coverage(cont)
  {
  }